

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O2

iterator __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::find(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
       *this,key_type *key)

{
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar1;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_ctemplate::TemplateString>,_std::_Select1st<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>
  *this_00;
  iterator iVar2;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar3;
  long lVar4;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar5;
  long lVar6;
  iterator iVar7;
  
  lVar4 = (long)this->size_;
  if (lVar4 < 0) {
    this_00 = &map(this)->_M_t;
    iVar2 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_ctemplate::TemplateString>,_std::_Select1st<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>
            ::find(this_00,key);
    pMVar3 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
  }
  else {
    lVar6 = lVar4 + 1;
    iVar2._M_node = (_Base_ptr)0x0;
    pMVar5 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             ((long)&this[-1].field_2 + 0x88);
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        pMVar3 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
                 ((long)&this->field_2 + lVar4 * 0x28);
        iVar2._M_node = (_Base_ptr)0x0;
        break;
      }
      pMVar3 = pMVar5 + 1;
      pMVar1 = pMVar5 + 1;
      pMVar5 = pMVar3;
    } while (*(key_type *)pMVar1->space_ != *key);
  }
  iVar7.hash_iter_._M_node = iVar2._M_node;
  iVar7.array_iter_ = pMVar3;
  return iVar7;
}

Assistant:

iterator find(const key_type& key) {
    key_equal compare;
    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, key)) {
          return iterator(array_ + i);
        }
      }
      return iterator(array_ + size_);
    } else {
      return iterator(map()->find(key));
    }
  }